

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O1

void ncnn::transpose_pack_B_tile(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined8 uVar21;
  size_t *psVar22;
  undefined1 (*pauVar23) [32];
  undefined1 (*pauVar24) [32];
  undefined1 (*pauVar25) [16];
  undefined4 *puVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  
  iVar1 = B->elempack;
  psVar22 = (size_t *)&B->w;
  if (B->dims == 3) {
    psVar22 = &B->cstep;
  }
  iVar2 = (int)*psVar22;
  pauVar23 = (undefined1 (*) [32])BT->data;
  lVar33 = 0;
  lVar29 = (long)iVar2;
  lVar34 = (long)j;
  if (0xb < max_jj) {
    lVar33 = (long)(iVar2 * k);
    lVar35 = lVar34 * 0x20 + lVar33 * 4 + 0x160;
    lVar27 = lVar34 * 0x10 + lVar33 * 4 + 0xb0;
    lVar30 = lVar33 * 4 + lVar34 * 4 + 0x20;
    lVar32 = 0;
    do {
      if (7 < max_kk && iVar1 == 8) {
        pauVar24 = (undefined1 (*) [32])((long)B->data + lVar35);
        iVar31 = 7;
        do {
          auVar20 = vunpcklps_avx(pauVar24[-0xb],pauVar24[-10]);
          auVar13 = vunpckhps_avx(pauVar24[-0xb],pauVar24[-10]);
          auVar44 = vunpcklps_avx(pauVar24[-9],pauVar24[-8]);
          auVar39 = vunpckhps_avx(pauVar24[-9],pauVar24[-8]);
          auVar50 = vunpcklps_avx(pauVar24[-7],pauVar24[-6]);
          auVar38 = vunpckhps_avx(pauVar24[-7],pauVar24[-6]);
          auVar42 = vunpcklps_avx(pauVar24[-5],pauVar24[-4]);
          auVar14 = vunpckhps_avx(pauVar24[-5],pauVar24[-4]);
          auVar45 = vunpcklps_avx(pauVar24[-3],pauVar24[-2]);
          auVar40 = vunpckhps_avx(pauVar24[-3],pauVar24[-2]);
          auVar46 = vunpcklps_avx(pauVar24[-1],*pauVar24);
          auVar15 = vunpckhps_avx(pauVar24[-1],*pauVar24);
          auVar41 = vunpcklpd_avx(auVar20,auVar44);
          auVar20 = vunpckhpd_avx(auVar20,auVar44);
          auVar44 = vunpcklpd_avx(auVar13,auVar39);
          auVar13 = vunpckhpd_avx(auVar13,auVar39);
          auVar43 = vunpcklpd_avx(auVar50,auVar42);
          auVar39 = vunpckhpd_avx(auVar50,auVar42);
          auVar50 = vunpcklpd_avx(auVar38,auVar14);
          auVar38 = vunpckhpd_avx(auVar38,auVar14);
          auVar42 = vunpcklpd_avx(auVar45,auVar46);
          auVar14 = vunpckhpd_avx(auVar45,auVar46);
          auVar45 = vunpcklpd_avx(auVar40,auVar15);
          auVar40 = vunpckhpd_avx(auVar40,auVar15);
          auVar46._16_16_ = auVar43._0_16_;
          auVar46._0_16_ = auVar41._0_16_;
          auVar15 = vperm2f128_avx(auVar41,auVar43,0x31);
          auVar48._16_16_ = auVar20._0_16_;
          auVar48._0_16_ = auVar42._0_16_;
          auVar20 = vperm2f128_avx(auVar42,auVar20,0x31);
          auVar41._16_16_ = auVar14._0_16_;
          auVar41._0_16_ = auVar39._0_16_;
          auVar39 = vperm2f128_avx(auVar39,auVar14,0x31);
          auVar43._16_16_ = auVar50._0_16_;
          auVar43._0_16_ = auVar44._0_16_;
          auVar14 = vperm2f128_avx(auVar44,auVar50,0x31);
          auVar50._16_16_ = auVar13._0_16_;
          auVar50._0_16_ = auVar45._0_16_;
          auVar13 = vperm2f128_avx(auVar45,auVar13,0x31);
          auVar44._16_16_ = auVar40._0_16_;
          auVar44._0_16_ = auVar38._0_16_;
          auVar38 = vperm2f128_avx(auVar38,auVar40,0x31);
          *pauVar23 = auVar46;
          pauVar23[1] = auVar48;
          pauVar23[2] = auVar41;
          pauVar23[3] = auVar43;
          pauVar23[4] = auVar50;
          pauVar23[5] = auVar44;
          pauVar23[6] = auVar15;
          pauVar23[7] = auVar20;
          pauVar23[8] = auVar39;
          pauVar23[9] = auVar14;
          pauVar23[10] = auVar13;
          pauVar23[0xb] = auVar38;
          pauVar23 = pauVar23 + 0xc;
          pauVar24 = (undefined1 (*) [32])(*pauVar24 + (long)(iVar2 * 8) * 4);
          iVar31 = iVar31 + 8;
        } while (iVar31 < max_kk);
      }
      if (3 < max_kk && iVar1 == 4) {
        pauVar25 = (undefined1 (*) [16])((long)B->data + lVar27);
        iVar31 = 3;
        do {
          auVar16 = vunpcklps_avx(pauVar25[-0xb],pauVar25[-10]);
          auVar17 = vunpcklps_avx(pauVar25[-9],pauVar25[-8]);
          auVar8 = vunpckhps_avx(pauVar25[-0xb],pauVar25[-10]);
          auVar9 = vunpckhps_avx(pauVar25[-9],pauVar25[-8]);
          auVar4 = vmovlhps_avx(auVar16,auVar17);
          auVar5 = vunpckhpd_avx(auVar16,auVar17);
          auVar16 = vmovlhps_avx(auVar8,auVar9);
          auVar6 = vunpckhpd_avx(auVar8,auVar9);
          auVar9 = vunpcklps_avx(pauVar25[-7],pauVar25[-6]);
          auVar18 = vunpcklps_avx(pauVar25[-5],pauVar25[-4]);
          auVar17 = vunpckhps_avx(pauVar25[-7],pauVar25[-6]);
          auVar10 = vunpckhps_avx(pauVar25[-5],pauVar25[-4]);
          auVar8 = vmovlhps_avx(auVar9,auVar18);
          auVar18 = vunpckhpd_avx(auVar9,auVar18);
          auVar9 = vmovlhps_avx(auVar17,auVar10);
          auVar7 = vunpckhpd_avx(auVar17,auVar10);
          auVar10 = vunpcklps_avx(pauVar25[-3],pauVar25[-2]);
          auVar19 = vunpcklps_avx(pauVar25[-1],*pauVar25);
          auVar11 = vunpckhps_avx(pauVar25[-3],pauVar25[-2]);
          auVar12 = vunpckhps_avx(pauVar25[-1],*pauVar25);
          auVar17 = vmovlhps_avx(auVar10,auVar19);
          auVar19 = vunpckhpd_avx(auVar10,auVar19);
          auVar10 = vmovlhps_avx(auVar11,auVar12);
          auVar11 = vunpckhpd_avx(auVar11,auVar12);
          *(undefined1 (*) [16])*pauVar23 = auVar4;
          *(undefined1 (*) [16])(*pauVar23 + 0x10) = auVar8;
          *(undefined1 (*) [16])pauVar23[1] = auVar17;
          *(undefined1 (*) [16])(pauVar23[1] + 0x10) = auVar5;
          *(undefined1 (*) [16])pauVar23[2] = auVar18;
          *(undefined1 (*) [16])(pauVar23[2] + 0x10) = auVar19;
          *(undefined1 (*) [16])pauVar23[3] = auVar16;
          *(undefined1 (*) [16])(pauVar23[3] + 0x10) = auVar9;
          *(undefined1 (*) [16])pauVar23[4] = auVar10;
          *(undefined1 (*) [16])(pauVar23[4] + 0x10) = auVar6;
          *(undefined1 (*) [16])pauVar23[5] = auVar7;
          *(undefined1 (*) [16])(pauVar23[5] + 0x10) = auVar11;
          pauVar23 = pauVar23 + 6;
          pauVar25 = (undefined1 (*) [16])(*pauVar25 + (long)(iVar2 * 4) * 4);
          iVar31 = iVar31 + 4;
        } while (iVar31 < max_kk);
      }
      if (0 < max_kk && iVar1 == 1) {
        pauVar25 = (undefined1 (*) [16])((long)B->data + lVar30);
        iVar31 = max_kk;
        do {
          uVar21 = *(undefined8 *)(pauVar25[-2] + 8);
          *(undefined8 *)*pauVar23 = *(undefined8 *)pauVar25[-2];
          *(undefined8 *)(*pauVar23 + 8) = uVar21;
          uVar21 = *(undefined8 *)(pauVar25[-1] + 8);
          *(undefined8 *)(*pauVar23 + 0x10) = *(undefined8 *)pauVar25[-1];
          *(undefined8 *)(*pauVar23 + 0x18) = uVar21;
          *(undefined1 (*) [16])pauVar23[1] = *pauVar25;
          pauVar23 = (undefined1 (*) [32])(pauVar23[1] + 0x10);
          pauVar25 = (undefined1 (*) [16])(*pauVar25 + lVar29 * 4);
          iVar31 = iVar31 + -1;
        } while (iVar31 != 0);
      }
      lVar33 = lVar32 + 0xc;
      uVar28 = lVar32 + 0x17;
      lVar35 = lVar35 + 0x180;
      lVar27 = lVar27 + 0xc0;
      lVar30 = lVar30 + 0x30;
      lVar32 = lVar33;
    } while (uVar28 < (uint)max_jj);
  }
  lVar32 = (long)max_jj;
  if ((int)lVar33 + 7 < max_jj) {
    lVar30 = (long)(iVar2 * k);
    lVar27 = (long)(int)lVar33;
    lVar37 = (lVar27 + lVar34) * 0x20 + lVar30 * 4 + 0xe0;
    lVar35 = (lVar27 + lVar34) * 0x10 + lVar30 * 4 + 0x70;
    lVar30 = lVar34 * 4 + lVar27 * 4 + lVar30 * 4 + 0x10;
    do {
      if (7 < max_kk && iVar1 == 8) {
        pauVar24 = (undefined1 (*) [32])((long)B->data + lVar37);
        iVar31 = 7;
        do {
          auVar20 = vunpcklps_avx(pauVar24[-7],pauVar24[-6]);
          auVar13 = vunpckhps_avx(pauVar24[-7],pauVar24[-6]);
          auVar15 = vunpcklps_avx(pauVar24[-5],pauVar24[-4]);
          auVar39 = vunpckhps_avx(pauVar24[-5],pauVar24[-4]);
          auVar44 = vunpcklps_avx(pauVar24[-3],pauVar24[-2]);
          auVar38 = vunpckhps_avx(pauVar24[-3],pauVar24[-2]);
          auVar43 = vunpcklps_avx(pauVar24[-1],*pauVar24);
          auVar14 = vunpckhps_avx(pauVar24[-1],*pauVar24);
          auVar40 = vunpcklpd_avx(auVar20,auVar15);
          auVar20 = vunpckhpd_avx(auVar20,auVar15);
          auVar15 = vunpcklpd_avx(auVar13,auVar39);
          auVar13 = vunpckhpd_avx(auVar13,auVar39);
          auVar41 = vunpcklpd_avx(auVar44,auVar43);
          auVar39 = vunpckhpd_avx(auVar44,auVar43);
          auVar44 = vunpcklpd_avx(auVar38,auVar14);
          auVar38 = vunpckhpd_avx(auVar38,auVar14);
          auVar42._16_16_ = auVar41._0_16_;
          auVar42._0_16_ = auVar40._0_16_;
          auVar45._16_16_ = auVar39._0_16_;
          auVar45._0_16_ = auVar20._0_16_;
          auVar47._16_16_ = auVar44._0_16_;
          auVar47._0_16_ = auVar15._0_16_;
          auVar49._16_16_ = auVar38._0_16_;
          auVar49._0_16_ = auVar13._0_16_;
          auVar14 = vperm2f128_avx(auVar40,auVar41,0x31);
          auVar20 = vperm2f128_avx(auVar20,auVar39,0x31);
          auVar39 = vperm2f128_avx(auVar15,auVar44,0x31);
          auVar13 = vperm2f128_avx(auVar13,auVar38,0x31);
          *pauVar23 = auVar42;
          pauVar23[1] = auVar45;
          pauVar23[2] = auVar47;
          pauVar23[3] = auVar49;
          pauVar23[4] = auVar14;
          pauVar23[5] = auVar20;
          pauVar23[6] = auVar39;
          pauVar23[7] = auVar13;
          pauVar23 = pauVar23 + 8;
          pauVar24 = (undefined1 (*) [32])(*pauVar24 + (long)(iVar2 * 8) * 4);
          iVar31 = iVar31 + 8;
        } while (iVar31 < max_kk);
      }
      if (3 < max_kk && iVar1 == 4) {
        pauVar25 = (undefined1 (*) [16])((long)B->data + lVar35);
        iVar31 = 3;
        do {
          auVar16 = vunpcklps_avx(pauVar25[-7],pauVar25[-6]);
          auVar17 = vunpcklps_avx(pauVar25[-5],pauVar25[-4]);
          auVar8 = vunpckhps_avx(pauVar25[-7],pauVar25[-6]);
          auVar9 = vunpckhps_avx(pauVar25[-5],pauVar25[-4]);
          auVar4 = vmovlhps_avx(auVar16,auVar17);
          auVar17 = vunpckhpd_avx(auVar16,auVar17);
          auVar16 = vmovlhps_avx(auVar8,auVar9);
          auVar10 = vunpckhpd_avx(auVar8,auVar9);
          auVar9 = vunpcklps_avx(pauVar25[-3],pauVar25[-2]);
          auVar5 = vunpcklps_avx(pauVar25[-1],*pauVar25);
          auVar6 = vunpckhps_avx(pauVar25[-3],pauVar25[-2]);
          auVar18 = vunpckhps_avx(pauVar25[-1],*pauVar25);
          auVar8 = vmovlhps_avx(auVar9,auVar5);
          auVar5 = vunpckhpd_avx(auVar9,auVar5);
          auVar9 = vmovlhps_avx(auVar6,auVar18);
          auVar6 = vunpckhpd_avx(auVar6,auVar18);
          *(undefined1 (*) [16])*pauVar23 = auVar4;
          *(undefined1 (*) [16])(*pauVar23 + 0x10) = auVar8;
          *(undefined1 (*) [16])pauVar23[1] = auVar17;
          *(undefined1 (*) [16])(pauVar23[1] + 0x10) = auVar5;
          *(undefined1 (*) [16])pauVar23[2] = auVar16;
          *(undefined1 (*) [16])(pauVar23[2] + 0x10) = auVar9;
          *(undefined1 (*) [16])pauVar23[3] = auVar10;
          *(undefined1 (*) [16])(pauVar23[3] + 0x10) = auVar6;
          pauVar23 = pauVar23 + 4;
          pauVar25 = (undefined1 (*) [16])(*pauVar25 + (long)(iVar2 * 4) * 4);
          iVar31 = iVar31 + 4;
        } while (iVar31 < max_kk);
      }
      if (0 < max_kk && iVar1 == 1) {
        pauVar25 = (undefined1 (*) [16])((long)B->data + lVar30);
        iVar31 = max_kk;
        do {
          uVar21 = *(undefined8 *)(pauVar25[-1] + 8);
          *(undefined8 *)*pauVar23 = *(undefined8 *)pauVar25[-1];
          *(undefined8 *)(*pauVar23 + 8) = uVar21;
          *(undefined1 (*) [16])(*pauVar23 + 0x10) = *pauVar25;
          pauVar23 = pauVar23 + 1;
          pauVar25 = (undefined1 (*) [16])(*pauVar25 + lVar29 * 4);
          iVar31 = iVar31 + -1;
        } while (iVar31 != 0);
      }
      lVar33 = lVar27 + 8;
      lVar37 = lVar37 + 0x100;
      lVar35 = lVar35 + 0x80;
      lVar30 = lVar30 + 0x20;
      bVar3 = lVar27 < lVar32 + -0xf;
      lVar27 = lVar33;
    } while (bVar3);
  }
  if ((int)((uint)lVar33 | 3) < max_jj) {
    lVar27 = (long)(iVar2 * k);
    lVar30 = (long)(int)(uint)lVar33;
    lVar37 = (lVar30 + lVar34) * 0x20 + lVar27 * 4 + 0x60;
    lVar35 = (lVar30 + lVar34) * 0x10 + lVar27 * 4 + 0x30;
    lVar27 = lVar34 * 4 + lVar30 * 4 + lVar27 * 4;
    do {
      if (7 < max_kk && iVar1 == 8) {
        pauVar24 = (undefined1 (*) [32])((long)B->data + lVar37);
        iVar31 = 7;
        do {
          auVar20 = vunpcklps_avx(pauVar24[-3],pauVar24[-2]);
          auVar13 = vunpckhps_avx(pauVar24[-3],pauVar24[-2]);
          auVar14 = vunpcklps_avx(pauVar24[-1],*pauVar24);
          auVar39 = vunpckhps_avx(pauVar24[-1],*pauVar24);
          auVar38 = vunpcklpd_avx(auVar20,auVar14);
          auVar20 = vunpckhpd_avx(auVar20,auVar14);
          auVar14 = vunpcklpd_avx(auVar13,auVar39);
          auVar13 = vunpckhpd_avx(auVar13,auVar39);
          auVar39._16_16_ = auVar20._0_16_;
          auVar39._0_16_ = auVar38._0_16_;
          auVar40._16_16_ = auVar13._0_16_;
          auVar40._0_16_ = auVar14._0_16_;
          auVar20 = vperm2f128_avx(auVar38,auVar20,0x31);
          auVar13 = vperm2f128_avx(auVar14,auVar13,0x31);
          *pauVar23 = auVar39;
          pauVar23[1] = auVar40;
          pauVar23[2] = auVar20;
          pauVar23[3] = auVar13;
          pauVar23 = pauVar23 + 4;
          iVar31 = iVar31 + 8;
          pauVar24 = (undefined1 (*) [32])(*pauVar24 + (long)(iVar2 * 8) * 4);
        } while (iVar31 < max_kk);
      }
      if (3 < max_kk && iVar1 == 4) {
        pauVar25 = (undefined1 (*) [16])((long)B->data + lVar35);
        iVar31 = 3;
        do {
          auVar16 = vunpcklps_avx(pauVar25[-3],pauVar25[-2]);
          auVar8 = vunpcklps_avx(pauVar25[-1],*pauVar25);
          auVar9 = vunpckhps_avx(pauVar25[-3],pauVar25[-2]);
          auVar17 = vunpckhps_avx(pauVar25[-1],*pauVar25);
          auVar4 = vmovlhps_avx(auVar16,auVar8);
          auVar8 = vunpckhpd_avx(auVar16,auVar8);
          auVar16 = vmovlhps_avx(auVar9,auVar17);
          auVar9 = vunpckhpd_avx(auVar9,auVar17);
          *(undefined1 (*) [16])*pauVar23 = auVar4;
          *(undefined1 (*) [16])(*pauVar23 + 0x10) = auVar8;
          *(undefined1 (*) [16])pauVar23[1] = auVar16;
          *(undefined1 (*) [16])(pauVar23[1] + 0x10) = auVar9;
          pauVar23 = pauVar23 + 2;
          iVar31 = iVar31 + 4;
          pauVar25 = (undefined1 (*) [16])(*pauVar25 + (long)(iVar2 * 4) * 4);
        } while (iVar31 < max_kk);
      }
      if (0 < max_kk && iVar1 == 1) {
        pauVar25 = (undefined1 (*) [16])((long)B->data + lVar27);
        iVar31 = max_kk;
        do {
          *(undefined1 (*) [16])*pauVar23 = *pauVar25;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          pauVar25 = (undefined1 (*) [16])(*pauVar25 + lVar29 * 4);
          iVar31 = iVar31 + -1;
        } while (iVar31 != 0);
      }
      lVar33 = lVar30 + 4;
      lVar36 = lVar30 + 7;
      lVar37 = lVar37 + 0x80;
      lVar35 = lVar35 + 0x40;
      lVar27 = lVar27 + 0x10;
      lVar30 = lVar33;
    } while (lVar36 < lVar32);
  }
  if ((int)((uint)lVar33 | 1) < max_jj) {
    lVar35 = (long)(iVar2 * k);
    lVar27 = (long)(int)(uint)lVar33;
    lVar37 = (lVar27 + lVar34) * 0x20 + lVar35 * 4 + 0x20;
    lVar30 = (lVar27 + lVar34) * 0x10 + lVar35 * 4 + 0x10;
    lVar35 = lVar34 * 4 + lVar27 * 4 + lVar35 * 4 + 4;
    do {
      if (7 < max_kk && iVar1 == 8) {
        pauVar24 = (undefined1 (*) [32])((long)B->data + lVar37);
        iVar31 = 7;
        do {
          auVar13 = vunpcklps_avx(pauVar24[-1],*pauVar24);
          auVar20 = vunpckhps_avx(pauVar24[-1],*pauVar24);
          auVar38._16_16_ = auVar20._0_16_;
          auVar38._0_16_ = auVar13._0_16_;
          auVar20 = vperm2f128_avx(auVar13,auVar20,0x31);
          *pauVar23 = auVar38;
          pauVar23[1] = auVar20;
          pauVar23 = pauVar23 + 2;
          iVar31 = iVar31 + 8;
          pauVar24 = (undefined1 (*) [32])(*pauVar24 + (long)(iVar2 * 8) * 4);
        } while (iVar31 < max_kk);
      }
      if (3 < max_kk && iVar1 == 4) {
        pauVar25 = (undefined1 (*) [16])((long)B->data + lVar30);
        iVar31 = 3;
        do {
          auVar16 = vunpcklps_avx(pauVar25[-1],*pauVar25);
          auVar4 = vunpckhps_avx(pauVar25[-1],*pauVar25);
          *(undefined1 (*) [16])*pauVar23 = auVar16;
          *(undefined1 (*) [16])(*pauVar23 + 0x10) = auVar4;
          pauVar23 = pauVar23 + 1;
          iVar31 = iVar31 + 4;
          pauVar25 = (undefined1 (*) [16])(*pauVar25 + (long)(iVar2 * 4) * 4);
        } while (iVar31 < max_kk);
      }
      if (0 < max_kk && iVar1 == 1) {
        puVar26 = (undefined4 *)((long)B->data + lVar35);
        iVar31 = max_kk;
        do {
          *(undefined4 *)*pauVar23 = puVar26[-1];
          *(undefined4 *)(*pauVar23 + 4) = *puVar26;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 8);
          puVar26 = puVar26 + lVar29;
          iVar31 = iVar31 + -1;
        } while (iVar31 != 0);
      }
      lVar33 = lVar27 + 2;
      lVar36 = lVar27 + 3;
      lVar37 = lVar37 + 0x40;
      lVar30 = lVar30 + 0x20;
      lVar35 = lVar35 + 8;
      lVar27 = lVar33;
    } while (lVar36 < lVar32);
  }
  if ((int)lVar33 < max_jj) {
    lVar35 = (long)(k * iVar2);
    lVar30 = (long)(int)lVar33;
    lVar33 = (lVar30 + lVar34) * 0x20 + lVar35 * 4;
    lVar27 = (lVar30 + lVar34) * 0x10 + lVar35 * 4;
    lVar34 = lVar35 * 4 + lVar34 * 4 + lVar30 * 4;
    do {
      if (7 < max_kk && iVar1 == 8) {
        pauVar24 = (undefined1 (*) [32])((long)B->data + lVar33);
        iVar31 = 7;
        do {
          *pauVar23 = *pauVar24;
          pauVar23 = pauVar23 + 1;
          iVar31 = iVar31 + 8;
          pauVar24 = (undefined1 (*) [32])(*pauVar24 + (long)(iVar2 * 8) * 4);
        } while (iVar31 < max_kk);
      }
      if (3 < max_kk && iVar1 == 4) {
        pauVar25 = (undefined1 (*) [16])((long)B->data + lVar27);
        iVar31 = 3;
        do {
          *(undefined1 (*) [16])*pauVar23 = *pauVar25;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          iVar31 = iVar31 + 4;
          pauVar25 = (undefined1 (*) [16])(*pauVar25 + (long)(iVar2 * 4) * 4);
        } while (iVar31 < max_kk);
      }
      if (0 < max_kk && iVar1 == 1) {
        puVar26 = (undefined4 *)((long)B->data + lVar34);
        iVar31 = max_kk;
        do {
          *(undefined4 *)*pauVar23 = *puVar26;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 4);
          puVar26 = puVar26 + lVar29;
          iVar31 = iVar31 + -1;
        } while (iVar31 != 0);
      }
      lVar30 = lVar30 + 1;
      lVar33 = lVar33 + 0x20;
      lVar27 = lVar27 + 0x10;
      lVar34 = lVar34 + 4;
    } while (lVar30 != lVar32);
  }
  return;
}

Assistant:

static void transpose_pack_B_tile(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    const int elempack = B.elempack;
    const int B_hstep = B.dims == 3 ? (int)B.cstep : B.w;

    float* pp = BT;

    int jj = 0;
#if __SSE2__
    for (; jj + 11 < max_jj; jj += 12)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                __m512 _r8 = _mm512_load_ps(p0 + 16 * 8);
                __m512 _r9 = _mm512_load_ps(p0 + 16 * 9);
                __m512 _ra = _mm512_load_ps(p0 + 16 * 10);
                __m512 _rb = _mm512_load_ps(p0 + 16 * 11);
                transpose16x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                _mm512_store_ps(pp + 16 * 8, _r8);
                _mm512_store_ps(pp + 16 * 9, _r9);
                _mm512_store_ps(pp + 16 * 10, _ra);
                _mm512_store_ps(pp + 16 * 11, _rb);
                pp += 192;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                __m256 _r8 = _mm256_load_ps(p0 + 8 * 8);
                __m256 _r9 = _mm256_load_ps(p0 + 8 * 9);
                __m256 _ra = _mm256_load_ps(p0 + 8 * 10);
                __m256 _rb = _mm256_load_ps(p0 + 8 * 11);
                transpose8x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                _mm256_store_ps(pp + 8 * 8, _r8);
                _mm256_store_ps(pp + 8 * 9, _r9);
                _mm256_store_ps(pp + 8 * 10, _ra);
                _mm256_store_ps(pp + 8 * 11, _rb);
                pp += 96;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                __m128 _r8 = _mm_load_ps(p0 + 4 * 8);
                __m128 _r9 = _mm_load_ps(p0 + 4 * 9);
                __m128 _ra = _mm_load_ps(p0 + 4 * 10);
                __m128 _rb = _mm_load_ps(p0 + 4 * 11);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r8);
                _mm_store_ps(pp + 4 * 3, _r1);
                _mm_store_ps(pp + 4 * 4, _r5);
                _mm_store_ps(pp + 4 * 5, _r9);
                _mm_store_ps(pp + 4 * 6, _r2);
                _mm_store_ps(pp + 4 * 7, _r6);
                _mm_store_ps(pp + 4 * 8, _ra);
                _mm_store_ps(pp + 4 * 9, _r3);
                _mm_store_ps(pp + 4 * 10, _r7);
                _mm_store_ps(pp + 4 * 11, _rb);
                pp += 48;
                p0 += B_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                _mm_store_ps(pp + 4, _mm_loadu_ps(p0 + 4));
                _mm_store_ps(pp + 8, _mm_loadu_ps(p0 + 8));
                pp += 12;
                p0 += B_hstep;
            }
        }
    }
    for (; jj + 7 < max_jj; jj += 8)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                pp += 128;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r1);
                _mm_store_ps(pp + 4 * 3, _r5);
                _mm_store_ps(pp + 4 * 4, _r2);
                _mm_store_ps(pp + 4 * 5, _r6);
                _mm_store_ps(pp + 4 * 6, _r3);
                _mm_store_ps(pp + 4 * 7, _r7);
                pp += 32;
                p0 += B_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                _mm_store_ps(pp + 4, _mm_loadu_ps(p0 + 4));
                pp += 8;
                p0 += B_hstep;
            }
        }
    }
    for (; jj + 3 < max_jj; jj += 4)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                pp += 64;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                pp += 32;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r1);
                _mm_store_ps(pp + 4 * 2, _r2);
                _mm_store_ps(pp + 4 * 3, _r3);
                pp += 16;
                p0 += B_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += B_hstep;
            }
        }
    }
#endif // __SSE2__
    for (; jj + 1 < max_jj; jj += 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16);
                transpose16x2_ps(_r0, _r1);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16, _r1);
                pp += 32;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8);
                transpose8x2_ps(_r0, _r1);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                pp += 16;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += B_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                pp += 2;
                p0 += B_hstep;
            }
        }
    }
    for (; jj < max_jj; jj += 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                _mm512_store_ps(pp, _mm512_load_ps(p0));
                pp += 16;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                pp += 8;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += B_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0 += B_hstep;
            }
        }
    }
}